

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::RunContext::handleUnexpectedInflightException
          (RunContext *this,AssertionInfo *info,string *message,AssertionReaction *reaction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  AssertionResult assertionResult;
  AssertionResultData local_110;
  AssertionResult local_b8;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar3 = (info->macroName).m_start;
  sVar4 = (info->macroName).m_size;
  pcVar5 = (info->lineInfo).file;
  sVar6 = (info->lineInfo).line;
  sVar7 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar7;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar5;
  (this->m_lastAssertionInfo).lineInfo.line = sVar6;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar3;
  (this->m_lastAssertionInfo).macroName.m_size = sVar4;
  paVar1 = &local_110.message.field_2;
  local_110.message._M_string_length = 0;
  local_110.message.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_110.reconstructedExpression.field_2;
  local_110.reconstructedExpression._M_string_length = 0;
  local_110.reconstructedExpression.field_2._M_local_buf[0] = '\0';
  local_110.lazyExpression.m_transientExpression = (ITransientExpression *)0x0;
  local_110.lazyExpression.m_isNegated = false;
  local_110.resultType = ThrewException;
  local_110.message._M_dataplus._M_p = (pointer)paVar1;
  local_110.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_110.message,message);
  AssertionResult::AssertionResult(&local_b8,info,&local_110);
  assertionEnded(this,&local_b8);
  iVar9 = (*this->m_config->_vptr_IConfig[6])();
  reaction->shouldDebugBreak = SUB41(iVar9,0);
  iVar9 = (*(this->super_IResultCapture)._vptr_IResultCapture[0x19])(this);
  bVar8 = true;
  if ((char)iVar9 == '\0') {
    bVar8 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
  }
  reaction->shouldThrow = bVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &local_b8.m_resultData.reconstructedExpression.field_2) {
    operator_delete(local_b8.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    local_b8.m_resultData.reconstructedExpression.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.m_resultData.message._M_dataplus._M_p != &local_b8.m_resultData.message.field_2) {
    operator_delete(local_b8.m_resultData.message._M_dataplus._M_p,
                    local_b8.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_110.reconstructedExpression._M_dataplus._M_p,
                    CONCAT71(local_110.reconstructedExpression.field_2._M_allocated_capacity._1_7_,
                             local_110.reconstructedExpression.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_110.message._M_dataplus._M_p,
                    CONCAT71(local_110.message.field_2._M_allocated_capacity._1_7_,
                             local_110.message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void RunContext::handleUnexpectedInflightException(
        AssertionInfo const &info,
        std::string const &message,
        AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data(ResultWas::ThrewException, LazyExpression(false));
        data.message = message;
        AssertionResult assertionResult{ info, data };
        assertionEnded(assertionResult);
        populateReaction(reaction);
    }